

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O1

void icu_63::number::impl::PatternParser::parseToExistingPropertiesImpl
               (UnicodeString *pattern,DecimalFormatProperties *properties,
               IgnoreRounding ignoreRounding,UErrorCode *status)

{
  short sVar1;
  int iVar2;
  ParsedPatternInfo patternInfo;
  ParsedPatternInfo local_1f0;
  
  sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (pattern->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  if (iVar2 != 0) {
    ParsedPatternInfo::ParsedPatternInfo(&local_1f0);
    ParsedPatternInfo::consumePattern(&local_1f0,pattern,status);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      patternInfoToProperties(properties,&local_1f0,ignoreRounding,status);
    }
    ParsedPatternInfo::~ParsedPatternInfo(&local_1f0);
    return;
  }
  DecimalFormatProperties::clear(properties);
  return;
}

Assistant:

void PatternParser::parseToExistingPropertiesImpl(const UnicodeString& pattern,
                                                  DecimalFormatProperties& properties,
                                                  IgnoreRounding ignoreRounding, UErrorCode& status) {
    if (pattern.length() == 0) {
        // Backwards compatibility requires that we reset to the default values.
        // TODO: Only overwrite the properties that "saveToProperties" normally touches?
        properties.clear();
        return;
    }

    ParsedPatternInfo patternInfo;
    parseToPatternInfo(pattern, patternInfo, status);
    if (U_FAILURE(status)) { return; }
    patternInfoToProperties(properties, patternInfo, ignoreRounding, status);
}